

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void av1_iadst8_low1_ssse3(__m128i *input,__m128i *output)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined2 uVar33;
  short sVar34;
  uint uVar35;
  int iVar36;
  undefined4 uVar37;
  int iVar38;
  int32_t *piVar39;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i _in;
  __m128i _w1;
  __m128i _w0;
  __m128i x [8];
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i cospi_p48_m16;
  __m128i cospi_p16_p48;
  __m128i __rounding;
  __m128i __zero;
  int32_t *cospi;
  int8_t cos_bit;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined2 local_778;
  undefined2 uStack_776;
  undefined2 uStack_774;
  undefined2 uStack_772;
  undefined2 local_768;
  undefined2 uStack_766;
  undefined2 uStack_764;
  undefined2 uStack_762;
  undefined2 local_738;
  undefined2 uStack_736;
  undefined2 uStack_734;
  undefined2 uStack_732;
  undefined2 local_728;
  undefined2 uStack_726;
  undefined2 uStack_724;
  undefined2 uStack_722;
  undefined2 uStack_710;
  undefined2 uStack_70e;
  undefined2 uStack_70c;
  undefined2 uStack_70a;
  undefined2 uStack_700;
  undefined2 uStack_6fe;
  undefined2 uStack_6fc;
  undefined2 uStack_6fa;
  undefined2 uStack_6d0;
  undefined2 uStack_6ce;
  undefined2 uStack_6cc;
  undefined2 uStack_6ca;
  undefined2 uStack_6c0;
  undefined2 uStack_6be;
  undefined2 uStack_6bc;
  undefined2 uStack_6ba;
  int local_528;
  int iStack_524;
  int iStack_520;
  int iStack_51c;
  int local_508;
  int iStack_504;
  int iStack_500;
  int iStack_4fc;
  int local_4e8;
  int iStack_4e4;
  int iStack_4e0;
  int iStack_4dc;
  int local_4c8;
  int iStack_4c4;
  int iStack_4c0;
  int iStack_4bc;
  int local_4a8;
  int iStack_4a4;
  int iStack_4a0;
  int iStack_49c;
  int local_488;
  int iStack_484;
  int iStack_480;
  int iStack_47c;
  int local_468;
  int iStack_464;
  int iStack_460;
  int iStack_45c;
  int local_448;
  int iStack_444;
  int iStack_440;
  int iStack_43c;
  int local_428;
  int iStack_424;
  int iStack_420;
  int iStack_41c;
  int local_408;
  int iStack_404;
  int iStack_400;
  int iStack_3fc;
  int local_3e8;
  int iStack_3e4;
  int iStack_3e0;
  int iStack_3dc;
  int local_3c8;
  int iStack_3c4;
  int iStack_3c0;
  int iStack_3bc;
  
  piVar39 = cospi_arr(0xc);
  uVar35 = (uint)*(ushort *)(piVar39 + 0x10) | piVar39[0x30] << 0x10;
  iVar36 = (uint)*(ushort *)(piVar39 + 0x30) + piVar39[0x10] * -0x10000;
  uVar37 = CONCAT22((short)piVar39[0x20],(short)piVar39[0x20]);
  uVar29 = CONCAT44(uVar37,uVar37);
  uVar30 = CONCAT44(uVar37,uVar37);
  iVar38 = (piVar39[0x20] & 0xffffU) + piVar39[0x20] * -0x10000;
  uVar31 = CONCAT44(iVar38,iVar38);
  uVar32 = CONCAT44(iVar38,iVar38);
  uVar33 = (undefined2)(piVar39[0x3c] << 3);
  auVar40._2_2_ = uVar33;
  auVar40._0_2_ = uVar33;
  auVar40._4_2_ = uVar33;
  auVar40._6_2_ = uVar33;
  auVar40._10_2_ = uVar33;
  auVar40._8_2_ = uVar33;
  auVar40._12_2_ = uVar33;
  auVar40._14_2_ = uVar33;
  sVar34 = (short)piVar39[4] * -8;
  auVar41._2_2_ = sVar34;
  auVar41._0_2_ = sVar34;
  auVar41._4_2_ = sVar34;
  auVar41._6_2_ = sVar34;
  auVar41._10_2_ = sVar34;
  auVar41._8_2_ = sVar34;
  auVar41._12_2_ = sVar34;
  auVar41._14_2_ = sVar34;
  auVar40 = pmulhrsw(*in_RDI,auVar40);
  auVar41 = pmulhrsw(*in_RDI,auVar41);
  local_8e8 = auVar40._0_8_;
  uStack_8e0 = auVar40._8_8_;
  local_728 = auVar40._0_2_;
  uStack_726 = auVar40._2_2_;
  uStack_724 = auVar40._4_2_;
  uStack_722 = auVar40._6_2_;
  local_738 = auVar41._0_2_;
  uStack_736 = auVar41._2_2_;
  uStack_734 = auVar41._4_2_;
  uStack_732 = auVar41._6_2_;
  uStack_6c0 = auVar40._8_2_;
  uStack_6be = auVar40._10_2_;
  uStack_6bc = auVar40._12_2_;
  uStack_6ba = auVar40._14_2_;
  uStack_6d0 = auVar41._8_2_;
  uStack_6ce = auVar41._10_2_;
  uStack_6cc = auVar41._12_2_;
  uStack_6ca = auVar41._14_2_;
  auVar16._2_2_ = local_738;
  auVar16._0_2_ = local_728;
  auVar16._4_2_ = uStack_726;
  auVar16._6_2_ = uStack_736;
  auVar16._10_2_ = uStack_734;
  auVar16._8_2_ = uStack_724;
  auVar16._12_2_ = uStack_722;
  auVar16._14_2_ = uStack_732;
  auVar15._8_8_ = CONCAT44(uVar35,uVar35);
  auVar15._0_8_ = CONCAT44(uVar35,uVar35);
  auVar40 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = uStack_6d0;
  auVar14._0_2_ = uStack_6c0;
  auVar14._4_2_ = uStack_6be;
  auVar14._6_2_ = uStack_6ce;
  auVar14._10_2_ = uStack_6cc;
  auVar14._8_2_ = uStack_6bc;
  auVar14._12_2_ = uStack_6ba;
  auVar14._14_2_ = uStack_6ca;
  auVar13._8_8_ = CONCAT44(uVar35,uVar35);
  auVar13._0_8_ = CONCAT44(uVar35,uVar35);
  auVar42 = pmaddwd(auVar14,auVar13);
  auVar12._2_2_ = local_738;
  auVar12._0_2_ = local_728;
  auVar12._4_2_ = uStack_726;
  auVar12._6_2_ = uStack_736;
  auVar12._10_2_ = uStack_734;
  auVar12._8_2_ = uStack_724;
  auVar12._12_2_ = uStack_722;
  auVar12._14_2_ = uStack_732;
  auVar11._8_8_ = CONCAT44(iVar36,iVar36);
  auVar11._0_8_ = CONCAT44(iVar36,iVar36);
  auVar43 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = uStack_6d0;
  auVar10._0_2_ = uStack_6c0;
  auVar10._4_2_ = uStack_6be;
  auVar10._6_2_ = uStack_6ce;
  auVar10._10_2_ = uStack_6cc;
  auVar10._8_2_ = uStack_6bc;
  auVar10._12_2_ = uStack_6ba;
  auVar10._14_2_ = uStack_6ca;
  auVar9._8_8_ = CONCAT44(iVar36,iVar36);
  auVar9._0_8_ = CONCAT44(iVar36,iVar36);
  auVar44 = pmaddwd(auVar10,auVar9);
  local_3c8 = auVar40._0_4_;
  iStack_3c4 = auVar40._4_4_;
  iStack_3c0 = auVar40._8_4_;
  iStack_3bc = auVar40._12_4_;
  local_3e8 = auVar42._0_4_;
  iStack_3e4 = auVar42._4_4_;
  iStack_3e0 = auVar42._8_4_;
  iStack_3dc = auVar42._12_4_;
  local_408 = auVar43._0_4_;
  iStack_404 = auVar43._4_4_;
  iStack_400 = auVar43._8_4_;
  iStack_3fc = auVar43._12_4_;
  local_428 = auVar44._0_4_;
  iStack_424 = auVar44._4_4_;
  iStack_420 = auVar44._8_4_;
  iStack_41c = auVar44._12_4_;
  auVar40 = ZEXT416(0xc);
  auVar42 = ZEXT416(0xc);
  auVar43 = ZEXT416(0xc);
  auVar44 = ZEXT416(0xc);
  auVar28._4_4_ = iStack_3c4 + 0x800 >> auVar40;
  auVar28._0_4_ = local_3c8 + 0x800 >> auVar40;
  auVar28._12_4_ = iStack_3bc + 0x800 >> auVar40;
  auVar28._8_4_ = iStack_3c0 + 0x800 >> auVar40;
  auVar27._4_4_ = iStack_3e4 + 0x800 >> auVar42;
  auVar27._0_4_ = local_3e8 + 0x800 >> auVar42;
  auVar27._12_4_ = iStack_3dc + 0x800 >> auVar42;
  auVar27._8_4_ = iStack_3e0 + 0x800 >> auVar42;
  auVar40 = packssdw(auVar28,auVar27);
  auVar26._4_4_ = iStack_404 + 0x800 >> auVar43;
  auVar26._0_4_ = local_408 + 0x800 >> auVar43;
  auVar26._12_4_ = iStack_3fc + 0x800 >> auVar43;
  auVar26._8_4_ = iStack_400 + 0x800 >> auVar43;
  auVar25._4_4_ = iStack_424 + 0x800 >> auVar44;
  auVar25._0_4_ = local_428 + 0x800 >> auVar44;
  auVar25._12_4_ = iStack_41c + 0x800 >> auVar44;
  auVar25._8_4_ = iStack_420 + 0x800 >> auVar44;
  auVar42 = packssdw(auVar26,auVar25);
  local_898 = auVar42._0_8_;
  uStack_890 = auVar42._8_8_;
  auVar8._2_2_ = local_738;
  auVar8._0_2_ = local_728;
  auVar8._4_2_ = uStack_726;
  auVar8._6_2_ = uStack_736;
  auVar8._10_2_ = uStack_734;
  auVar8._8_2_ = uStack_724;
  auVar8._12_2_ = uStack_722;
  auVar8._14_2_ = uStack_732;
  auVar7._8_8_ = uVar30;
  auVar7._0_8_ = uVar29;
  auVar43 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = uStack_6d0;
  auVar6._0_2_ = uStack_6c0;
  auVar6._4_2_ = uStack_6be;
  auVar6._6_2_ = uStack_6ce;
  auVar6._10_2_ = uStack_6cc;
  auVar6._8_2_ = uStack_6bc;
  auVar6._12_2_ = uStack_6ba;
  auVar6._14_2_ = uStack_6ca;
  auVar5._8_8_ = uVar30;
  auVar5._0_8_ = uVar29;
  auVar44 = pmaddwd(auVar6,auVar5);
  auVar4._2_2_ = local_738;
  auVar4._0_2_ = local_728;
  auVar4._4_2_ = uStack_726;
  auVar4._6_2_ = uStack_736;
  auVar4._10_2_ = uStack_734;
  auVar4._8_2_ = uStack_724;
  auVar4._12_2_ = uStack_722;
  auVar4._14_2_ = uStack_732;
  auVar3._8_8_ = uVar32;
  auVar3._0_8_ = uVar31;
  auVar45 = pmaddwd(auVar4,auVar3);
  auVar48._2_2_ = uStack_6d0;
  auVar48._0_2_ = uStack_6c0;
  auVar48._4_2_ = uStack_6be;
  auVar48._6_2_ = uStack_6ce;
  auVar48._10_2_ = uStack_6cc;
  auVar48._8_2_ = uStack_6bc;
  auVar48._12_2_ = uStack_6ba;
  auVar48._14_2_ = uStack_6ca;
  auVar47._8_8_ = uVar32;
  auVar47._0_8_ = uVar31;
  auVar46 = pmaddwd(auVar48,auVar47);
  local_448 = auVar43._0_4_;
  iStack_444 = auVar43._4_4_;
  iStack_440 = auVar43._8_4_;
  iStack_43c = auVar43._12_4_;
  local_468 = auVar44._0_4_;
  iStack_464 = auVar44._4_4_;
  iStack_460 = auVar44._8_4_;
  iStack_45c = auVar44._12_4_;
  local_488 = auVar45._0_4_;
  iStack_484 = auVar45._4_4_;
  iStack_480 = auVar45._8_4_;
  iStack_47c = auVar45._12_4_;
  local_4a8 = auVar46._0_4_;
  iStack_4a4 = auVar46._4_4_;
  iStack_4a0 = auVar46._8_4_;
  iStack_49c = auVar46._12_4_;
  auVar43 = ZEXT416(0xc);
  auVar44 = ZEXT416(0xc);
  auVar45 = ZEXT416(0xc);
  auVar46 = ZEXT416(0xc);
  auVar24._4_4_ = iStack_444 + 0x800 >> auVar43;
  auVar24._0_4_ = local_448 + 0x800 >> auVar43;
  auVar24._12_4_ = iStack_43c + 0x800 >> auVar43;
  auVar24._8_4_ = iStack_440 + 0x800 >> auVar43;
  auVar23._4_4_ = iStack_464 + 0x800 >> auVar44;
  auVar23._0_4_ = local_468 + 0x800 >> auVar44;
  auVar23._12_4_ = iStack_45c + 0x800 >> auVar44;
  auVar23._8_4_ = iStack_460 + 0x800 >> auVar44;
  auVar47 = packssdw(auVar24,auVar23);
  auVar22._4_4_ = iStack_484 + 0x800 >> auVar45;
  auVar22._0_4_ = local_488 + 0x800 >> auVar45;
  auVar22._12_4_ = iStack_47c + 0x800 >> auVar45;
  auVar22._8_4_ = iStack_480 + 0x800 >> auVar45;
  auVar21._4_4_ = iStack_4a4 + 0x800 >> auVar46;
  auVar21._0_4_ = local_4a8 + 0x800 >> auVar46;
  auVar21._12_4_ = iStack_49c + 0x800 >> auVar46;
  auVar21._8_4_ = iStack_4a0 + 0x800 >> auVar46;
  auVar48 = packssdw(auVar22,auVar21);
  local_768 = auVar40._0_2_;
  uStack_766 = auVar40._2_2_;
  uStack_764 = auVar40._4_2_;
  uStack_762 = auVar40._6_2_;
  local_778 = auVar42._0_2_;
  uStack_776 = auVar42._2_2_;
  uStack_774 = auVar42._4_2_;
  uStack_772 = auVar42._6_2_;
  uStack_700 = auVar40._8_2_;
  uStack_6fe = auVar40._10_2_;
  uStack_6fc = auVar40._12_2_;
  uStack_6fa = auVar40._14_2_;
  uStack_710 = auVar42._8_2_;
  uStack_70e = auVar42._10_2_;
  uStack_70c = auVar42._12_2_;
  uStack_70a = auVar42._14_2_;
  auVar2._2_2_ = local_778;
  auVar2._0_2_ = local_768;
  auVar2._4_2_ = uStack_766;
  auVar2._6_2_ = uStack_776;
  auVar2._10_2_ = uStack_774;
  auVar2._8_2_ = uStack_764;
  auVar2._12_2_ = uStack_762;
  auVar2._14_2_ = uStack_772;
  auVar49._8_8_ = uVar30;
  auVar49._0_8_ = uVar29;
  auVar49 = pmaddwd(auVar2,auVar49);
  auVar1._2_2_ = uStack_710;
  auVar1._0_2_ = uStack_700;
  auVar1._4_2_ = uStack_6fe;
  auVar1._6_2_ = uStack_70e;
  auVar1._10_2_ = uStack_70c;
  auVar1._8_2_ = uStack_6fc;
  auVar1._12_2_ = uStack_6fa;
  auVar1._14_2_ = uStack_70a;
  auVar46._8_8_ = uVar30;
  auVar46._0_8_ = uVar29;
  auVar46 = pmaddwd(auVar1,auVar46);
  auVar45._2_2_ = local_778;
  auVar45._0_2_ = local_768;
  auVar45._4_2_ = uStack_766;
  auVar45._6_2_ = uStack_776;
  auVar45._10_2_ = uStack_774;
  auVar45._8_2_ = uStack_764;
  auVar45._12_2_ = uStack_762;
  auVar45._14_2_ = uStack_772;
  auVar44._8_8_ = uVar32;
  auVar44._0_8_ = uVar31;
  auVar44 = pmaddwd(auVar45,auVar44);
  auVar43._2_2_ = uStack_710;
  auVar43._0_2_ = uStack_700;
  auVar43._4_2_ = uStack_6fe;
  auVar43._6_2_ = uStack_70e;
  auVar43._10_2_ = uStack_70c;
  auVar43._8_2_ = uStack_6fc;
  auVar43._12_2_ = uStack_6fa;
  auVar43._14_2_ = uStack_70a;
  auVar42._8_8_ = uVar32;
  auVar42._0_8_ = uVar31;
  auVar42 = pmaddwd(auVar43,auVar42);
  local_4c8 = auVar49._0_4_;
  iStack_4c4 = auVar49._4_4_;
  iStack_4c0 = auVar49._8_4_;
  iStack_4bc = auVar49._12_4_;
  local_4e8 = auVar46._0_4_;
  iStack_4e4 = auVar46._4_4_;
  iStack_4e0 = auVar46._8_4_;
  iStack_4dc = auVar46._12_4_;
  local_508 = auVar44._0_4_;
  iStack_504 = auVar44._4_4_;
  iStack_500 = auVar44._8_4_;
  iStack_4fc = auVar44._12_4_;
  local_528 = auVar42._0_4_;
  iStack_524 = auVar42._4_4_;
  iStack_520 = auVar42._8_4_;
  iStack_51c = auVar42._12_4_;
  auVar42 = ZEXT416(0xc);
  auVar43 = ZEXT416(0xc);
  auVar44 = ZEXT416(0xc);
  auVar45 = ZEXT416(0xc);
  auVar20._4_4_ = iStack_4c4 + 0x800 >> auVar42;
  auVar20._0_4_ = local_4c8 + 0x800 >> auVar42;
  auVar20._12_4_ = iStack_4bc + 0x800 >> auVar42;
  auVar20._8_4_ = iStack_4c0 + 0x800 >> auVar42;
  auVar19._4_4_ = iStack_4e4 + 0x800 >> auVar43;
  auVar19._0_4_ = local_4e8 + 0x800 >> auVar43;
  auVar19._12_4_ = iStack_4dc + 0x800 >> auVar43;
  auVar19._8_4_ = iStack_4e0 + 0x800 >> auVar43;
  auVar42 = packssdw(auVar20,auVar19);
  auVar18._4_4_ = iStack_504 + 0x800 >> auVar44;
  auVar18._0_4_ = local_508 + 0x800 >> auVar44;
  auVar18._12_4_ = iStack_4fc + 0x800 >> auVar44;
  auVar18._8_4_ = iStack_500 + 0x800 >> auVar44;
  auVar17._4_4_ = iStack_524 + 0x800 >> auVar45;
  auVar17._0_4_ = local_528 + 0x800 >> auVar45;
  auVar17._12_4_ = iStack_51c + 0x800 >> auVar45;
  auVar17._8_4_ = iStack_520 + 0x800 >> auVar45;
  auVar43 = packssdw(auVar18,auVar17);
  *in_RSI = local_8e8;
  in_RSI[1] = uStack_8e0;
  auVar40 = psubsw(ZEXT816(0),auVar40);
  *(undefined1 (*) [16])(in_RSI + 2) = auVar40;
  local_888 = auVar42._0_8_;
  uStack_880 = auVar42._8_8_;
  in_RSI[4] = local_888;
  in_RSI[5] = uStack_880;
  auVar40 = psubsw(ZEXT816(0),auVar47);
  *(undefined1 (*) [16])(in_RSI + 6) = auVar40;
  local_8b8 = auVar48._0_8_;
  uStack_8b0 = auVar48._8_8_;
  in_RSI[8] = local_8b8;
  in_RSI[9] = uStack_8b0;
  auVar40 = psubsw(ZEXT816(0),auVar43);
  *(undefined1 (*) [16])(in_RSI + 10) = auVar40;
  in_RSI[0xc] = local_898;
  in_RSI[0xd] = uStack_890;
  auVar41 = psubsw(ZEXT816(0),auVar41);
  *(undefined1 (*) [16])(in_RSI + 0xe) = auVar41;
  return;
}

Assistant:

void av1_iadst8_low1_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __zero = _mm_setzero_si128();
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);

  // stage 1
  __m128i x[8];
  x[1] = input[0];

  // stage 2
  btf_16_ssse3(cospi[60], -cospi[4], x[1], x[0], x[1]);

  // stage 3
  x[4] = x[0];
  x[5] = x[1];

  // stage 4
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x[4], x[5], x[4], x[5]);

  // stage 5
  x[2] = x[0];
  x[3] = x[1];
  x[6] = x[4];
  x[7] = x[5];

  // stage 6
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[2], x[3], x[2], x[3]);
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[6], x[7], x[6], x[7]);

  // stage 7
  output[0] = x[0];
  output[1] = _mm_subs_epi16(__zero, x[4]);
  output[2] = x[6];
  output[3] = _mm_subs_epi16(__zero, x[2]);
  output[4] = x[3];
  output[5] = _mm_subs_epi16(__zero, x[7]);
  output[6] = x[5];
  output[7] = _mm_subs_epi16(__zero, x[1]);
}